

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IfElseProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::IfElseProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
          (BumpAllocator *this,Expression *args,ProdItem *args_1,
          optional<slang::ast::RandSeqProductionSymbol::ProdItem> *args_2)

{
  RandSeqProductionSymbol *pRVar1;
  pointer ppEVar2;
  size_t sVar3;
  undefined8 uVar4;
  RandSeqProductionSymbol *pRVar5;
  pointer ppEVar6;
  size_t sVar7;
  ProdBase PVar8;
  undefined4 uVar9;
  bool bVar10;
  undefined7 uVar11;
  IfElseProd *pIVar12;
  
  pIVar12 = (IfElseProd *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IfElseProd *)this->endPtr < pIVar12 + 1) {
    pIVar12 = (IfElseProd *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pIVar12 + 1);
  }
  PVar8.kind = (args_1->super_ProdBase).kind;
  uVar9 = *(undefined4 *)&args_1->field_0x4;
  pRVar1 = args_1->target;
  ppEVar2 = (args_1->args)._M_ptr;
  sVar3 = (args_1->args)._M_extent._M_extent_value;
  bVar10 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>)
           ._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
           _M_engaged;
  uVar11 = *(undefined7 *)
            &(args_2->
             super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>).
             _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
             field_0x21;
  uVar4 = *(undefined8 *)
           &(args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
            )._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>
            ._M_payload;
  pRVar5 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>)
           ._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
           _M_payload._M_value.target;
  ppEVar6 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
            )._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>
            ._M_payload._M_value.args._M_ptr;
  sVar7 = (args_2->super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>).
          _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
          _M_payload._M_value.args._M_extent._M_extent_value;
  (pIVar12->super_ProdBase).kind = IfElse;
  (pIVar12->expr).ptr = args;
  (pIVar12->ifItem).super_ProdBase = (ProdBase)PVar8.kind;
  *(undefined4 *)&(pIVar12->ifItem).field_0x4 = uVar9;
  (pIVar12->ifItem).target = pRVar1;
  (pIVar12->ifItem).args._M_ptr = ppEVar2;
  (pIVar12->ifItem).args._M_extent._M_extent_value = sVar3;
  *(undefined8 *)
   &(pIVar12->elseItem).
    super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload = uVar4;
  (pIVar12->elseItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload._M_value.
  target = pRVar5;
  (pIVar12->elseItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload._M_value.
  args._M_ptr = ppEVar6;
  (pIVar12->elseItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload._M_value.
  args._M_extent._M_extent_value = sVar7;
  (pIVar12->elseItem).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_engaged = bVar10;
  *(undefined7 *)
   &(pIVar12->elseItem).
    super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.field_0x21 = uVar11;
  return pIVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }